

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void std::pmr::formatBlock(void *address,size_t length)

{
  int local_30;
  int local_2c;
  int j;
  int i;
  byte *endAddr;
  byte *addr;
  size_t length_local;
  void *address_local;
  
  local_2c = 0;
  endAddr = (byte *)address;
  while (endAddr < (byte *)((long)address + length)) {
    if (local_2c % 4 == 0) {
      if (local_2c != 0) {
        printf("\n");
      }
      printf("%p:\t",endAddr);
    }
    else {
      printf("  ");
    }
    for (local_30 = 0; local_30 < 4 && endAddr < (byte *)((long)address + length);
        local_30 = local_30 + 1) {
      printf("%02x ",(ulong)*endAddr);
      endAddr = endAddr + 1;
    }
    local_2c = local_2c + 1;
  }
  printf("\n");
  return;
}

Assistant:

static
void formatBlock(void *address, std::size_t length)
    // Format in hex to 'stdout', a block of memory starting at the specified
    // starting 'address' of the specified 'length' (in bytes).  Each line of
    // formatted output will have a maximum of 16 bytes per line, where each
    // line starts with the address of that 16-byte chunk.
{
    byte *addr    = reinterpret_cast<byte *>(address);
    byte *endAddr = addr + length;

    for (int i = 0; addr < endAddr; ++i) {
        if (0 == i % 4) {
            if (i) {
                printf("\n");
            }
            printf("%p:\t", static_cast<void *>(addr));
        }
        else {
            printf("  ");
        }

        for (int j = 0; j < 4 && addr < endAddr; ++j) {
            printf("%02x ", *addr);
            ++addr;
        }
    }

    printf("\n");
}